

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCombinable.h
# Opt level: O0

void __thiscall
HighsCombinable<ThreadNeighbourhoodQueryData,HighsCliqueTable::queryNeighbourhood(std::vector<int,std::allocator<int>>&,long&,HighsCliqueTable::CliqueVar,HighsCliqueTable::CliqueVar*,int)const::$_0>
::
HighsCombinable<HighsCliqueTable::queryNeighbourhood(std::vector<int,std::allocator<int>>&,long&,HighsCliqueTable::CliqueVar,HighsCliqueTable::CliqueVar*,int)const::__0>
          (HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>
           *this,anon_class_4_1_54a397ee_for_construct_ *fConstruct)

{
  int iVar1;
  undefined4 *in_RSI;
  undefined4 *in_RDI;
  int i;
  size_t in_stack_ffffffffffffffb8;
  type in_stack_ffffffffffffffc0;
  int local_14;
  
  *in_RDI = *in_RSI;
  iVar1 = HighsTaskExecutor::getNumWorkerThreads();
  in_RDI[1] = iVar1;
  ::highs::cache_aligned::
  make_unique_array<HighsCombinable<ThreadNeighbourhoodQueryData,HighsCliqueTable::queryNeighbourhood(std::vector<int,std::allocator<int>>&,long&,HighsCliqueTable::CliqueVar,HighsCliqueTable::CliqueVar*,int)const::__0>::PaddedData>
            ((size_t)in_RDI);
  for (local_14 = 0; local_14 < (int)in_RDI[1]; local_14 = local_14 + 1) {
    in_stack_ffffffffffffffc0 =
         std::
         unique_ptr<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ERGO-Code[P]HiGHS/src/mip/HighsCliqueTable.cpp:455:59)>::PaddedData[],_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ERGO-Code[P]HiGHS/src/mip/HighsCliqueTable.cpp:455:59)>::PaddedData[]>_>
         ::operator[]((unique_ptr<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[],_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
                       *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    in_stack_ffffffffffffffc0->initialized_ = false;
  }
  return;
}

Assistant:

HighsCombinable(FConstruct&& fConstruct)
      : construct_(std::forward<FConstruct>(fConstruct)),
        numThreads(HighsTaskExecutor::getNumWorkerThreads()),
        threadCopies_(
            highs::cache_aligned::make_unique_array<PaddedData>(numThreads)) {
    for (int i = 0; i < numThreads; ++i) threadCopies_[i].initialized_ = false;
  }